

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterYs<unsigned_char>,_ImPlot::TransformerLogLog>::operator()
          (StairsRenderer<ImPlot::GetterYs<unsigned_char>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ImVec2 IVar7;
  byte bVar8;
  int iVar9;
  ImU32 IVar10;
  uint uVar11;
  GetterYs<unsigned_char> *pGVar12;
  TransformerLogLog *pTVar13;
  ImPlotPlot *pIVar14;
  ImDrawVert *pIVar15;
  ImDrawIdx *pIVar16;
  ImPlotContext *pIVar17;
  bool bVar18;
  ImDrawIdx IVar19;
  double dVar20;
  double dVar21;
  ImVec2 IVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  pIVar17 = GImPlot;
  pGVar12 = this->Getter;
  pTVar13 = this->Transformer;
  iVar9 = pGVar12->Count;
  bVar8 = pGVar12->Ys
          [(long)(((prim + 1 + pGVar12->Offset) % iVar9 + iVar9) % iVar9) * (long)pGVar12->Stride];
  dVar20 = log10(((double)(prim + 1) * pGVar12->XScale + pGVar12->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar3 = pIVar17->LogDenX;
  pIVar14 = pIVar17->CurrentPlot;
  dVar4 = (pIVar14->XAxis).Range.Min;
  dVar5 = (pIVar14->XAxis).Range.Max;
  dVar21 = log10((double)bVar8 / pIVar14->YAxis[pTVar13->YAxis].Range.Min);
  iVar9 = pTVar13->YAxis;
  pIVar14 = pIVar17->CurrentPlot;
  dVar6 = pIVar14->YAxis[iVar9].Range.Min;
  IVar22.x = (float)((((double)(float)(dVar20 / dVar3) * (dVar5 - dVar4) + dVar4) -
                     (pIVar14->XAxis).Range.Min) * pIVar17->Mx +
                    (double)pIVar17->PixelRange[iVar9].Min.x);
  fVar23 = (float)((((double)(float)(dVar21 / pIVar17->LogDenY[iVar9]) *
                     (pIVar14->YAxis[iVar9].Range.Max - dVar6) + dVar6) - dVar6) *
                   pIVar17->My[iVar9] + (double)pIVar17->PixelRange[iVar9].Min.y);
  fVar2 = (this->P1).x;
  fVar24 = (this->P1).y;
  fVar25 = fVar24;
  if (fVar23 <= fVar24) {
    fVar25 = fVar23;
  }
  bVar18 = false;
  if ((fVar25 < (cull_rect->Max).y) &&
     (fVar24 = (float)(-(uint)(fVar23 <= fVar24) & (uint)fVar24 |
                      ~-(uint)(fVar23 <= fVar24) & (uint)fVar23), pfVar1 = &(cull_rect->Min).y,
     bVar18 = false, *pfVar1 <= fVar24 && fVar24 != *pfVar1)) {
    fVar24 = fVar2;
    if (IVar22.x <= fVar2) {
      fVar24 = IVar22.x;
    }
    if (fVar24 < (cull_rect->Max).x) {
      fVar24 = (float)(~-(uint)(IVar22.x <= fVar2) & (uint)IVar22.x |
                      -(uint)(IVar22.x <= fVar2) & (uint)fVar2);
      bVar18 = (cull_rect->Min).x <= fVar24 && fVar24 != (cull_rect->Min).x;
    }
  }
  if (bVar18 != false) {
    fVar24 = (this->P1).y;
    fVar25 = fVar24 + this->HalfWeight;
    fVar24 = fVar24 - this->HalfWeight;
    IVar10 = this->Col;
    IVar7 = *uv;
    pIVar15 = DrawList->_VtxWritePtr;
    (pIVar15->pos).x = fVar2;
    (pIVar15->pos).y = fVar25;
    DrawList->_VtxWritePtr->uv = IVar7;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15->col = IVar10;
    pIVar15[1].pos.x = IVar22.x;
    pIVar15[1].pos.y = fVar24;
    DrawList->_VtxWritePtr[1].uv = IVar7;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[1].col = IVar10;
    pIVar15[2].pos.x = fVar2;
    pIVar15[2].pos.y = fVar24;
    pIVar15[2].uv = IVar7;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[2].col = IVar10;
    pIVar15[3].pos.x = IVar22.x;
    pIVar15[3].pos.y = fVar25;
    pIVar15[3].uv = IVar7;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[3].col = IVar10;
    DrawList->_VtxWritePtr = pIVar15 + 4;
    uVar11 = DrawList->_VtxCurrentIdx;
    pIVar16 = DrawList->_IdxWritePtr;
    IVar19 = (ImDrawIdx)uVar11;
    *pIVar16 = IVar19;
    pIVar16[1] = IVar19 + 1;
    pIVar16[2] = IVar19 + 2;
    pIVar16[3] = IVar19;
    pIVar16[4] = IVar19 + 1;
    pIVar16[5] = IVar19 + 3;
    DrawList->_IdxWritePtr = pIVar16 + 6;
    DrawList->_VtxCurrentIdx = uVar11 + 4;
    fVar25 = IVar22.x - this->HalfWeight;
    fVar24 = this->HalfWeight + IVar22.x;
    fVar2 = (this->P1).y;
    IVar10 = this->Col;
    IVar7 = *uv;
    pIVar15[4].pos.x = fVar25;
    pIVar15[4].pos.y = fVar23;
    DrawList->_VtxWritePtr->uv = IVar7;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15->col = IVar10;
    pIVar15[1].pos.x = fVar24;
    pIVar15[1].pos.y = fVar2;
    DrawList->_VtxWritePtr[1].uv = IVar7;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[1].col = IVar10;
    pIVar15[2].pos.x = fVar25;
    pIVar15[2].pos.y = fVar2;
    pIVar15[2].uv = IVar7;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[2].col = IVar10;
    pIVar15[3].pos.x = fVar24;
    pIVar15[3].pos.y = fVar23;
    pIVar15[3].uv = IVar7;
    pIVar15 = DrawList->_VtxWritePtr;
    pIVar15[3].col = IVar10;
    DrawList->_VtxWritePtr = pIVar15 + 4;
    uVar11 = DrawList->_VtxCurrentIdx;
    pIVar16 = DrawList->_IdxWritePtr;
    IVar19 = (ImDrawIdx)uVar11;
    *pIVar16 = IVar19;
    pIVar16[1] = IVar19 + 1;
    pIVar16[2] = IVar19 + 2;
    pIVar16[3] = IVar19;
    pIVar16[4] = IVar19 + 1;
    pIVar16[5] = IVar19 + 3;
    DrawList->_IdxWritePtr = pIVar16 + 6;
    DrawList->_VtxCurrentIdx = uVar11 + 4;
  }
  IVar22.y = fVar23;
  this->P1 = IVar22;
  return bVar18;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }